

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  void *pvVar1;
  string *this_00;
  CppType CVar2;
  long *in_RDI;
  RepeatedField<int> *in_stack_ffffffffffffff80;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    CVar2 = anon_unknown_19::cpp_type('\0');
    if (CVar2 == CPPTYPE_STRING) {
      this_00 = (string *)*in_RDI;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string(this_00);
        operator_delete(this_00);
      }
    }
    else if (CVar2 == CPPTYPE_MESSAGE) {
      if ((*(byte *)((long)in_RDI + 10) >> 4 & 1) == 0) {
        if ((long *)*in_RDI != (long *)0x0) {
          (**(code **)(*(long *)*in_RDI + 8))();
        }
      }
      else if ((long *)*in_RDI != (long *)0x0) {
        (**(code **)(*(long *)*in_RDI + 8))();
      }
    }
  }
  else {
    CVar2 = anon_unknown_19::cpp_type('\0');
    switch(CVar2) {
    case CPPTYPE_INT32:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<int>::~RepeatedField(in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_INT64:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_UINT32:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<unsigned_int>::~RepeatedField
                  ((RepeatedField<unsigned_int> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_UINT64:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<unsigned_long>::~RepeatedField
                  ((RepeatedField<unsigned_long> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_DOUBLE:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<double>::~RepeatedField((RepeatedField<double> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_FLOAT:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_BOOL:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_ENUM:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedField<int>::~RepeatedField(in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_STRING:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
      break;
    case CPPTYPE_MESSAGE:
      pvVar1 = (void *)*in_RDI;
      if (pvVar1 != (void *)0x0) {
        RepeatedPtrField<google::protobuf::MessageLite>::~RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::MessageLite> *)in_stack_ffffffffffffff80);
        operator_delete(pvVar1);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    delete repeated_##LOWERCASE##_value;    \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}